

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open_address_file_hash.c
# Opt level: O2

ion_err_t oafh_initialize(ion_file_hashmap_t *hashmap,
                         _func_ion_hash_t_ion_file_hashmap_t_ptr_ion_key_t_int *hashing_function,
                         ion_key_type_t key_type,ion_key_size_t key_size,ion_value_size_t value_size
                         ,int size,ion_dictionary_id_t id)

{
  int iVar1;
  int iVar2;
  int iVar3;
  FILE *pFVar4;
  undefined1 *__ptr;
  size_t sVar5;
  size_t sVar6;
  int iVar7;
  char addr_filename [12];
  
  hashmap->write_concern = '\x01';
  (hashmap->super).record.key_size = key_size;
  (hashmap->super).record.value_size = value_size;
  (hashmap->super).key_type = key_type;
  hashmap->map_size = size;
  hashmap->compute_hash = (_func_int_ion_file_hashmap_t_ptr_ion_key_t_int *)hashing_function;
  iVar2 = dictionary_get_filename(id,"oaf",addr_filename);
  iVar7 = 0x12;
  if (iVar2 < 0xc) {
    pFVar4 = fopen(addr_filename,"r+b");
    hashmap->file = (FILE *)pFVar4;
    iVar7 = 0;
    if (pFVar4 == (FILE *)0x0) {
      pFVar4 = fopen(addr_filename,"w+b");
      hashmap->file = (FILE *)pFVar4;
      iVar2 = (hashmap->super).record.key_size;
      iVar1 = (hashmap->super).record.value_size;
      __ptr = (undefined1 *)calloc((long)(iVar1 + 1 + iVar2),1);
      *__ptr = 0xff;
      iVar3 = 0;
      while( true ) {
        if (hashmap->map_size <= iVar7) break;
        sVar5 = fwrite(__ptr,1,1,(FILE *)hashmap->file);
        sVar6 = fwrite(__ptr + 1,(long)(iVar1 + iVar2),1,(FILE *)hashmap->file);
        iVar3 = (int)sVar6 + iVar3 + (int)sVar5;
        iVar7 = iVar7 + 1;
      }
      fflush((FILE *)hashmap->file);
      if (iVar3 / 2 == hashmap->map_size) {
        free(__ptr);
        iVar7 = 0;
      }
      else {
        fclose((FILE *)hashmap->file);
        iVar7 = 7;
      }
    }
  }
  return (ion_err_t)iVar7;
}

Assistant:

ion_err_t
oafh_initialize(
	ion_file_hashmap_t *hashmap,
	ion_hash_t (*hashing_function)(ion_file_hashmap_t *, ion_key_t, int),
	ion_key_type_t key_type,
	ion_key_size_t key_size,
	ion_value_size_t value_size,
	int size,
	ion_dictionary_id_t id
) {
	hashmap->write_concern				= wc_insert_unique;			/* By default allow unique inserts only */
	hashmap->super.record.key_size		= key_size;
	hashmap->super.record.value_size	= value_size;
	hashmap->super.key_type				= key_type;

	/* The hash map is allocated as a single contiguous file*/
	hashmap->map_size					= size;

	hashmap->compute_hash				= (*hashing_function);	/* Allows for binding of different hash functions
																depending on requirements */

	char addr_filename[ION_MAX_FILENAME_LENGTH];

	/* open the file */
	int actual_filename_length = dictionary_get_filename(id, "oaf", addr_filename);

	if (actual_filename_length >= ION_MAX_FILENAME_LENGTH) {
		return err_uninitialized;
	}

	hashmap->file = fopen(addr_filename, "r+b");

	if (NULL != hashmap->file) {
		return err_ok;
	}

	/* open the file */
	hashmap->file = fopen(addr_filename, "w+b");

	ion_hash_bucket_t *file_record;

	int record_size = SIZEOF(STATUS) + hashmap->super.record.key_size + hashmap->super.record.value_size;

	file_record			= calloc(record_size, 1);
	file_record->status = ION_EMPTY;

	/* write out the records to disk to prep */
#if ION_DEBUG
	printf("Initializing hash table\n");
#endif

	int i, writes = 0;

	for (i = 0; i < hashmap->map_size; i++) {
		writes	+= fwrite(&file_record->status, SIZEOF(STATUS), 1, hashmap->file);
		writes	+= fwrite(file_record->data, record_size - SIZEOF(STATUS), 1, hashmap->file);
	}

	fflush(hashmap->file);

	if (writes / 2 != hashmap->map_size) {
		fclose(hashmap->file);
		return err_file_write_error;
	}

	free(file_record);

	return err_ok;
}